

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>>::
find<0ul,char_const(&)[4]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>> *this,
          char (*params) [7])

{
  long lVar1;
  char (*in_RDX) [7];
  ArrayPtr<kj::StringPtr> table;
  HashIndex<kj::_::(anonymous_namespace)::BadHasher> local_28 [8];
  long local_20;
  
  table.ptr = params[4] + 4;
  table.size_ = *(size_t *)params;
  HashIndex<kj::_::(anonymous_namespace)::BadHasher>::find<kj::StringPtr,char_const(&)[4]>
            (local_28,table,in_RDX);
  if (local_28[0] == (HashIndex<kj::_::(anonymous_namespace)::BadHasher>)0x1) {
    lVar1 = local_20 * 0x10 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}